

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O2

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          cmake *cm)

{
  bool bVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cmGlobalUnixMakefileGenerator3::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=(name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)0x0;
  }
  else {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x698);
    cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_00,cm);
  }
  return (cmGlobalGenerator *)this_00;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const CM_OVERRIDE
  {
    if (name != T::GetActualName()) {
      return CM_NULLPTR;
    }
    return new T(cm);
  }